

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32 tag,CodedOutputStream *output)

{
  byte bVar1;
  int iVar2;
  undefined4 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  byte *pbVar6;
  int64 iVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  size_t __n;
  uint8 *puVar14;
  uint32 first_byte_or_zero;
  ulong uVar15;
  pair<unsigned_long,_bool> pVar16;
  string temp;
  string local_50;
  
  if (tag < 8) {
    return false;
  }
  bVar5 = false;
  bVar13 = (byte)tag;
  switch(tag & 7) {
  case 0:
    puVar14 = input->buffer_;
    if ((puVar14 < input->buffer_end_) && (uVar15 = (ulong)(char)*puVar14, -1 < (long)uVar15)) {
      input->buffer_ = puVar14 + 1;
    }
    else {
      pVar16 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar15 = pVar16.first;
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    pbVar6 = output->cur_;
    if ((output->impl_).end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    }
    if (tag < 0x80) {
      *pbVar6 = bVar13;
      pbVar6 = pbVar6 + 1;
    }
    else {
      *pbVar6 = bVar13 | 0x80;
      if (tag < 0x4000) {
        pbVar6[1] = (byte)(tag >> 7);
        pbVar6 = pbVar6 + 2;
      }
      else {
        pbVar6 = pbVar6 + 2;
        uVar9 = tag >> 7;
        do {
          pbVar8 = pbVar6;
          pbVar8[-1] = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar6 = pbVar8 + 1;
          bVar5 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar5);
        *pbVar8 = (byte)uVar10;
      }
    }
    output->cur_ = pbVar6;
    if ((output->impl_).end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    }
    if (uVar15 < 0x80) {
      *pbVar6 = (byte)uVar15;
      pbVar6 = pbVar6 + 1;
    }
    else {
      *pbVar6 = (byte)uVar15 | 0x80;
      if (uVar15 < 0x4000) {
        pbVar6[1] = (byte)(uVar15 >> 7);
        pbVar6 = pbVar6 + 2;
      }
      else {
        pbVar6 = pbVar6 + 2;
        uVar15 = uVar15 >> 7;
        do {
          pbVar8 = pbVar6;
          pbVar8[-1] = (byte)uVar15 | 0x80;
          uVar12 = uVar15 >> 7;
          pbVar6 = pbVar8 + 1;
          bVar5 = 0x3fff < uVar15;
          uVar15 = uVar12;
        } while (bVar5);
        *pbVar8 = (byte)uVar12;
      }
    }
    break;
  case 1:
    puVar14 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar14 < 8) {
      bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_50);
      if (!bVar5) {
        return false;
      }
    }
    else {
      local_50._M_dataplus._M_p = *(pointer *)puVar14;
      input->buffer_ = puVar14 + 8;
    }
    pbVar6 = output->cur_;
    if ((output->impl_).end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    }
    _Var4._M_p = local_50._M_dataplus._M_p;
    if (tag < 0x80) {
      *pbVar6 = bVar13;
      pbVar6 = pbVar6 + 1;
    }
    else {
      *pbVar6 = bVar13 | 0x80;
      if (tag < 0x4000) {
        pbVar6[1] = (byte)(tag >> 7);
        pbVar6 = pbVar6 + 2;
      }
      else {
        pbVar6 = pbVar6 + 2;
        uVar9 = tag >> 7;
        do {
          pbVar8 = pbVar6;
          pbVar8[-1] = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar6 = pbVar8 + 1;
          bVar5 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar5);
        *pbVar8 = (byte)uVar10;
      }
    }
    output->cur_ = pbVar6;
    if ((output->impl_).end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    }
    *(pointer *)pbVar6 = _Var4._M_p;
    pbVar6 = pbVar6 + 8;
    break;
  case 2:
    pbVar6 = input->buffer_;
    if (pbVar6 < input->buffer_end_) {
      bVar1 = *pbVar6;
      first_byte_or_zero = (uint32)bVar1;
      uVar9 = (uint)bVar1;
      if (-1 < (char)bVar1) {
        input->buffer_ = pbVar6 + 1;
        goto LAB_0028cd78;
      }
    }
    else {
      first_byte_or_zero = 0;
    }
    iVar7 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
    uVar9 = (uint)iVar7;
    if (iVar7 < 0) {
      return false;
    }
LAB_0028cd78:
    pbVar6 = output->cur_;
    if ((output->impl_).end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    }
    if (tag < 0x80) {
      *pbVar6 = bVar13;
      pbVar6 = pbVar6 + 1;
    }
    else {
      *pbVar6 = bVar13 | 0x80;
      if (tag < 0x4000) {
        pbVar6[1] = (byte)(tag >> 7);
        pbVar6 = pbVar6 + 2;
      }
      else {
        pbVar6 = pbVar6 + 2;
        uVar10 = tag >> 7;
        do {
          pbVar8 = pbVar6;
          pbVar8[-1] = (byte)uVar10 | 0x80;
          uVar11 = uVar10 >> 7;
          pbVar6 = pbVar8 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar5);
        *pbVar8 = (byte)uVar11;
      }
    }
    output->cur_ = pbVar6;
    if ((output->impl_).end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    }
    if (uVar9 < 0x80) {
      *pbVar6 = (byte)uVar9;
      pbVar6 = pbVar6 + 1;
    }
    else {
      *pbVar6 = (byte)uVar9 | 0x80;
      if (uVar9 < 0x4000) {
        pbVar6[1] = (byte)(uVar9 >> 7);
        pbVar6 = pbVar6 + 2;
      }
      else {
        pbVar6 = pbVar6 + 2;
        uVar10 = uVar9 >> 7;
        do {
          pbVar8 = pbVar6;
          pbVar8[-1] = (byte)uVar10 | 0x80;
          uVar11 = uVar10 >> 7;
          pbVar6 = pbVar8 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar5);
        *pbVar8 = (byte)uVar11;
      }
    }
    output->cur_ = pbVar6;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar5 = io::CodedInputStream::ReadString(input,&local_50,uVar9);
    if (bVar5) {
      puVar14 = output->cur_;
      __n = (size_t)(int)local_50._M_string_length;
      if ((long)(output->impl_).end_ - (long)puVar14 < (long)__n) {
        puVar14 = io::EpsCopyOutputStream::WriteRawFallback
                            (&output->impl_,local_50._M_dataplus._M_p,(int)local_50._M_string_length
                             ,puVar14);
      }
      else {
        memcpy(puVar14,local_50._M_dataplus._M_p,__n);
        puVar14 = puVar14 + __n;
      }
      output->cur_ = puVar14;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return bVar5;
    }
    operator_delete(local_50._M_dataplus._M_p);
    return bVar5;
  case 3:
    pbVar6 = output->cur_;
    if ((output->impl_).end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    }
    if (tag < 0x80) {
      *pbVar6 = bVar13;
      pbVar6 = pbVar6 + 1;
    }
    else {
      *pbVar6 = bVar13 | 0x80;
      if (tag < 0x4000) {
        pbVar6[1] = (byte)(tag >> 7);
        pbVar6 = pbVar6 + 2;
      }
      else {
        pbVar6 = pbVar6 + 2;
        uVar9 = tag >> 7;
        do {
          pbVar8 = pbVar6;
          pbVar8[-1] = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar6 = pbVar8 + 1;
          bVar5 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar5);
        *pbVar8 = (byte)uVar10;
      }
    }
    output->cur_ = pbVar6;
    iVar2 = input->recursion_budget_;
    input->recursion_budget_ = iVar2 + -1;
    if (iVar2 < 1) {
      return false;
    }
    bVar5 = SkipMessage(input,output);
    if (!bVar5) {
      return false;
    }
    if (input->recursion_budget_ < input->recursion_limit_) {
      input->recursion_budget_ = input->recursion_budget_ + 1;
    }
    return input->last_tag_ == (tag & 0xfffffff8 | 4);
  default:
    goto switchD_0028ca32_caseD_4;
  case 5:
    puVar14 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar14 < 4) {
      bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_50);
      if (!bVar5) {
        return false;
      }
    }
    else {
      local_50._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar14;
      input->buffer_ = puVar14 + 4;
    }
    pbVar6 = output->cur_;
    if ((output->impl_).end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    }
    if (tag < 0x80) {
      *pbVar6 = bVar13;
      pbVar6 = pbVar6 + 1;
    }
    else {
      *pbVar6 = bVar13 | 0x80;
      if (tag < 0x4000) {
        pbVar6[1] = (byte)(tag >> 7);
        pbVar6 = pbVar6 + 2;
      }
      else {
        pbVar6 = pbVar6 + 2;
        uVar9 = tag >> 7;
        do {
          pbVar8 = pbVar6;
          pbVar8[-1] = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar6 = pbVar8 + 1;
          bVar5 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar5);
        *pbVar8 = (byte)uVar10;
      }
    }
    output->cur_ = pbVar6;
    uVar3 = local_50._M_dataplus._M_p._0_4_;
    if ((output->impl_).end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
    }
    *(undefined4 *)pbVar6 = uVar3;
    pbVar6 = pbVar6 + 4;
  }
  output->cur_ = pbVar6;
  bVar5 = true;
switchD_0028ca32_caseD_4:
  return bVar5;
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32 tag,
                               io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO(mkilavuz): Provide API to prevent extra string copying.
      std::string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}